

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackBuilder.cpp
# Opt level: O2

void __thiscall
TrackBuilder::addAmigaSector(TrackBuilder *this,CylHead *cylhead,int sector,void *buf)

{
  int iVar1;
  uint dword;
  TrackBuilder *pTVar2;
  uint32_t checksum;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bits;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint32_t sector_label [4];
  
  addByte(this,0);
  addByteWithClock(this,0xa1,10);
  addByteWithClock(this,0xa1,10);
  iVar1 = 0xb;
  if (this->m_datarate == _500K) {
    iVar1 = 0x16;
  }
  checksum = 0;
  dword = sector << 8 | cylhead->cyl << 0x11 | cylhead->head << 0x10 | iVar1 - sector | 0xff000000;
  pTVar2 = (TrackBuilder *)(ulong)dword;
  addAmigaDword(this,dword,&checksum);
  sector_label[0] = 0;
  sector_label[1] = 0;
  sector_label[2] = 0;
  sector_label[3] = 0;
  splitAmigaBits(&bits,pTVar2,sector_label,0x10,&checksum);
  addAmigaBits(this,&bits);
  pTVar2 = (TrackBuilder *)(ulong)checksum;
  addAmigaDword(this,checksum,&checksum);
  checksum = 0;
  splitAmigaBits((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,pTVar2,buf,0x200,
                 &checksum);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&bits,&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  addAmigaDword(this,checksum,&checksum);
  addAmigaBits(this,&bits);
  addByte(this,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void TrackBuilder::addAmigaSector(const CylHead& cylhead, int sector, const void* buf)
{
    addByte(0x00);
    addByteWithClock(0xa1, 0x0a);   // A1 with missing clock bit
    addByteWithClock(0xa1, 0x0a);

    auto sectors = (m_datarate == DataRate::_500K) ? 22 : 11;
    auto remain = sectors - sector;

    uint32_t checksum = 0;
    uint32_t info = (0xff << 24) | (((cylhead.cyl << 1) | cylhead.head) << 16) |
        (sector << 8) | remain;
    addAmigaDword(info, checksum);

    uint32_t sector_label[4] = {};
    auto bits = splitAmigaBits(sector_label, sizeof(sector_label), checksum);
    addAmigaBits(bits);
    addAmigaDword(checksum, checksum);

    checksum = 0;
    bits = splitAmigaBits(buf, 512, checksum);
    addAmigaDword(checksum, checksum);
    addAmigaBits(bits);

    addByte(0x00);
}